

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  Schema *pSVar1;
  Schema *pSVar2;
  Trigger *pTVar3;
  int iVar4;
  HashElem *pHVar5;
  Trigger *pTVar6;
  
  if (pParse->disableTriggers == '\0') {
    pSVar1 = pParse->db->aDb[1].pSchema;
    pSVar2 = pTab->pSchema;
    if ((pSVar1 == pSVar2) || (pHVar5 = (pSVar1->trigHash).first, pHVar5 == (HashElem *)0x0)) {
      pTVar6 = (Trigger *)0x0;
    }
    else {
      pTVar6 = (Trigger *)0x0;
      do {
        pTVar3 = (Trigger *)pHVar5->data;
        if ((pTVar3->pTabSchema == pSVar2) &&
           (iVar4 = sqlite3StrICmp(pTVar3->table,pTab->zName), iVar4 == 0)) {
          if (pTVar6 == (Trigger *)0x0) {
            pTVar6 = pTab->pTrigger;
          }
          pTVar3->pNext = pTVar6;
          pTVar6 = pTVar3;
        }
        pHVar5 = pHVar5->next;
      } while (pHVar5 != (HashElem *)0x0);
    }
    if (pTVar6 == (Trigger *)0x0) {
      pTVar6 = pTab->pTrigger;
    }
  }
  else {
    pTVar6 = (Trigger *)0x0;
  }
  return pTVar6;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema * const pTmpSchema = pParse->db->aDb[1].pSchema;
  Trigger *pList = 0;                  /* List of triggers to return */

  if( pParse->disableTriggers ){
    return 0;
  }

  if( pTmpSchema!=pTab->pSchema ){
    HashElem *p;
    assert( sqlite3SchemaMutexHeld(pParse->db, 0, pTmpSchema) );
    for(p=sqliteHashFirst(&pTmpSchema->trigHash); p; p=sqliteHashNext(p)){
      Trigger *pTrig = (Trigger *)sqliteHashData(p);
      if( pTrig->pTabSchema==pTab->pSchema
       && 0==sqlite3StrICmp(pTrig->table, pTab->zName) 
      ){
        pTrig->pNext = (pList ? pList : pTab->pTrigger);
        pList = pTrig;
      }
    }
  }

  return (pList ? pList : pTab->pTrigger);
}